

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_joinref.cpp
# Opt level: O3

void duckdb::LogicalComparisonJoin::ExtractJoinConditions
               (ClientContext *context,JoinType type,JoinRefType ref_type,
               unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *left_child,
               unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *right_child,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *expressions,vector<duckdb::JoinCondition,_true> *conditions,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *arbitrary_expressions)

{
  type pLVar1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  left_bindings;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  right_bindings;
  
  left_bindings._M_h._M_buckets = &left_bindings._M_h._M_single_bucket;
  left_bindings._M_h._M_bucket_count = 1;
  left_bindings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  left_bindings._M_h._M_element_count = 0;
  left_bindings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  left_bindings._M_h._M_rehash_policy._M_next_resize = 0;
  left_bindings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  right_bindings._M_h._M_buckets = &right_bindings._M_h._M_single_bucket;
  right_bindings._M_h._M_bucket_count = 1;
  right_bindings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  right_bindings._M_h._M_element_count = 0;
  right_bindings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  right_bindings._M_h._M_rehash_policy._M_next_resize = 0;
  right_bindings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(left_child);
  LogicalJoin::GetTableReferences(pLVar1,&left_bindings);
  pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(right_child);
  LogicalJoin::GetTableReferences(pLVar1,&right_bindings);
  ExtractJoinConditions
            (context,type,ref_type,left_child,right_child,&left_bindings,&right_bindings,expressions
             ,conditions,arbitrary_expressions);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&right_bindings._M_h);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&left_bindings._M_h);
  return;
}

Assistant:

void LogicalComparisonJoin::ExtractJoinConditions(ClientContext &context, JoinType type, JoinRefType ref_type,
                                                  unique_ptr<LogicalOperator> &left_child,
                                                  unique_ptr<LogicalOperator> &right_child,
                                                  vector<unique_ptr<Expression>> &expressions,
                                                  vector<JoinCondition> &conditions,
                                                  vector<unique_ptr<Expression>> &arbitrary_expressions) {
	unordered_set<idx_t> left_bindings, right_bindings;
	LogicalJoin::GetTableReferences(*left_child, left_bindings);
	LogicalJoin::GetTableReferences(*right_child, right_bindings);
	return ExtractJoinConditions(context, type, ref_type, left_child, right_child, left_bindings, right_bindings,
	                             expressions, conditions, arbitrary_expressions);
}